

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrawfont_p.h
# Opt level: O2

void __thiscall QRawFontPrivate::setFontEngine(QRawFontPrivate *this,QFontEngine *engine)

{
  QAtomicInt *pQVar1;
  QFontEngine *pQVar2;
  
  pQVar2 = this->fontEngine;
  if (pQVar2 != engine) {
    if (pQVar2 != (QFontEngine *)0x0) {
      LOCK();
      pQVar1 = &pQVar2->ref;
      (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i == 0) && (this->fontEngine != (QFontEngine *)0x0)) {
        (*this->fontEngine->_vptr_QFontEngine[1])();
      }
    }
    this->fontEngine = engine;
    if (engine != (QFontEngine *)0x0) {
      LOCK();
      (engine->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (engine->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  return;
}

Assistant:

inline void setFontEngine(QFontEngine *engine)
    {
#ifndef QT_NO_DEBUG
        Q_ASSERT(fontEngine == nullptr || thread == QThread::currentThread());
#endif
        if (fontEngine == engine)
            return;

        if (fontEngine != nullptr) {
            if (!fontEngine->ref.deref())
                delete fontEngine;
#ifndef QT_NO_DEBUG
            thread = nullptr;
#endif
        }

        fontEngine = engine;

        if (fontEngine != nullptr) {
            fontEngine->ref.ref();
#ifndef QT_NO_DEBUG
            thread = QThread::currentThread();
            Q_ASSERT(thread);
#endif
        }
    }